

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

MMAL_PARAM_IMAGEFX_T __thiscall
raspicam::_private::Private_Impl::convertImageEffect
          (Private_Impl *this,RASPICAM_IMAGE_EFFECT imageEffect)

{
  RASPICAM_IMAGE_EFFECT imageEffect_local;
  Private_Impl *this_local;
  MMAL_PARAM_IMAGEFX_T local_4;
  
  switch(imageEffect) {
  case RASPICAM_IMAGE_EFFECT_NONE:
    local_4 = MMAL_PARAM_IMAGEFX_NONE;
    break;
  case RASPICAM_IMAGE_EFFECT_NEGATIVE:
    local_4 = MMAL_PARAM_IMAGEFX_NEGATIVE;
    break;
  case RASPICAM_IMAGE_EFFECT_SOLARIZE:
    local_4 = MMAL_PARAM_IMAGEFX_SOLARIZE;
    break;
  case RASPICAM_IMAGE_EFFECT_SKETCH:
    local_4 = MMAL_PARAM_IMAGEFX_SKETCH;
    break;
  case RASPICAM_IMAGE_EFFECT_DENOISE:
    local_4 = MMAL_PARAM_IMAGEFX_DENOISE;
    break;
  case RASPICAM_IMAGE_EFFECT_EMBOSS:
    local_4 = MMAL_PARAM_IMAGEFX_EMBOSS;
    break;
  case RASPICAM_IMAGE_EFFECT_OILPAINT:
    local_4 = MMAL_PARAM_IMAGEFX_OILPAINT;
    break;
  case RASPICAM_IMAGE_EFFECT_HATCH:
    local_4 = MMAL_PARAM_IMAGEFX_HATCH;
    break;
  case RASPICAM_IMAGE_EFFECT_GPEN:
    local_4 = MMAL_PARAM_IMAGEFX_GPEN;
    break;
  case RASPICAM_IMAGE_EFFECT_PASTEL:
    local_4 = MMAL_PARAM_IMAGEFX_PASTEL;
    break;
  case RASPICAM_IMAGE_EFFECT_WATERCOLOR:
    local_4 = MMAL_PARAM_IMAGEFX_WATERCOLOUR;
    break;
  case RASPICAM_IMAGE_EFFECT_FILM:
    local_4 = MMAL_PARAM_IMAGEFX_FILM;
    break;
  case RASPICAM_IMAGE_EFFECT_BLUR:
    local_4 = MMAL_PARAM_IMAGEFX_BLUR;
    break;
  case RASPICAM_IMAGE_EFFECT_SATURATION:
    local_4 = MMAL_PARAM_IMAGEFX_SATURATION;
    break;
  case RASPICAM_IMAGE_EFFECT_COLORSWAP:
    local_4 = MMAL_PARAM_IMAGEFX_COLOURSWAP;
    break;
  case RASPICAM_IMAGE_EFFECT_WASHEDOUT:
    local_4 = MMAL_PARAM_IMAGEFX_WASHEDOUT;
    break;
  case RASPICAM_IMAGE_EFFECT_POSTERISE:
    local_4 = MMAL_PARAM_IMAGEFX_POSTERISE;
    break;
  case RASPICAM_IMAGE_EFFECT_COLORPOINT:
    local_4 = MMAL_PARAM_IMAGEFX_COLOURPOINT;
    break;
  case RASPICAM_IMAGE_EFFECT_COLORBALANCE:
    local_4 = MMAL_PARAM_IMAGEFX_COLOURBALANCE;
    break;
  case RASPICAM_IMAGE_EFFECT_CARTOON:
    local_4 = MMAL_PARAM_IMAGEFX_CARTOON;
    break;
  default:
    local_4 = MMAL_PARAM_IMAGEFX_NONE;
  }
  return local_4;
}

Assistant:

MMAL_PARAM_IMAGEFX_T Private_Impl::convertImageEffect ( RASPICAM_IMAGE_EFFECT imageEffect ) {
            switch ( imageEffect ) {
            case RASPICAM_IMAGE_EFFECT_NONE:
                return MMAL_PARAM_IMAGEFX_NONE;
            case RASPICAM_IMAGE_EFFECT_NEGATIVE:
                return MMAL_PARAM_IMAGEFX_NEGATIVE;
            case RASPICAM_IMAGE_EFFECT_SOLARIZE:
                return MMAL_PARAM_IMAGEFX_SOLARIZE;
            case RASPICAM_IMAGE_EFFECT_SKETCH:
                return MMAL_PARAM_IMAGEFX_SKETCH;
            case RASPICAM_IMAGE_EFFECT_DENOISE:
                return MMAL_PARAM_IMAGEFX_DENOISE;
            case RASPICAM_IMAGE_EFFECT_EMBOSS:
                return MMAL_PARAM_IMAGEFX_EMBOSS;
            case RASPICAM_IMAGE_EFFECT_OILPAINT:
                return MMAL_PARAM_IMAGEFX_OILPAINT;
            case RASPICAM_IMAGE_EFFECT_HATCH:
                return MMAL_PARAM_IMAGEFX_HATCH;
            case RASPICAM_IMAGE_EFFECT_GPEN:
                return MMAL_PARAM_IMAGEFX_GPEN;
            case RASPICAM_IMAGE_EFFECT_PASTEL:
                return MMAL_PARAM_IMAGEFX_PASTEL;
            case RASPICAM_IMAGE_EFFECT_WATERCOLOR:
                return MMAL_PARAM_IMAGEFX_WATERCOLOUR;
            case RASPICAM_IMAGE_EFFECT_FILM:
                return MMAL_PARAM_IMAGEFX_FILM;
            case RASPICAM_IMAGE_EFFECT_BLUR:
                return MMAL_PARAM_IMAGEFX_BLUR;
            case RASPICAM_IMAGE_EFFECT_SATURATION:
                return MMAL_PARAM_IMAGEFX_SATURATION;
            case RASPICAM_IMAGE_EFFECT_COLORSWAP:
                return MMAL_PARAM_IMAGEFX_COLOURSWAP;
            case RASPICAM_IMAGE_EFFECT_WASHEDOUT:
                return MMAL_PARAM_IMAGEFX_WASHEDOUT;
            case RASPICAM_IMAGE_EFFECT_POSTERISE:
                return MMAL_PARAM_IMAGEFX_POSTERISE;
            case RASPICAM_IMAGE_EFFECT_COLORPOINT:
                return MMAL_PARAM_IMAGEFX_COLOURPOINT;
            case RASPICAM_IMAGE_EFFECT_COLORBALANCE:
                return MMAL_PARAM_IMAGEFX_COLOURBALANCE;
            case RASPICAM_IMAGE_EFFECT_CARTOON:
                return MMAL_PARAM_IMAGEFX_CARTOON;
            default:
                return MMAL_PARAM_IMAGEFX_NONE;
            }
        }